

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O2

void __thiscall
CoreML::Specification::ConvolutionLayerParams::_internal_add_stride
          (ConvolutionLayerParams *this,uint64_t value)

{
  uint64_t local_8;
  
  local_8 = value;
  google::protobuf::RepeatedField<unsigned_long>::Add(&this->stride_,&local_8);
  return;
}

Assistant:

inline void ConvolutionLayerParams::_internal_add_stride(uint64_t value) {
  stride_.Add(value);
}